

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::StencilTexturing::FunctionalTest::verifyTexture
          (FunctionalTest *this,GLuint id,GLenum source_internal_format,bool is_stencil,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src_texture_data)

{
  code *pcVar1;
  undefined4 uVar2;
  GLuint GVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar8;
  const_reference pvVar9;
  TestContext *pTVar10;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  float fVar13;
  MessageBuilder local_540;
  float local_3c0;
  float local_3bc;
  GLfloat src_depth;
  GLfloat dst_depth_1;
  float local_238;
  uint local_234;
  GLfloat src_depth_f;
  GLuint src_depth_i;
  GLfloat dst_depth;
  uint local_224;
  MessageBuilder local_220;
  byte local_9a;
  byte local_99;
  GLubyte src_stencil;
  float *pfStack_98;
  GLubyte dst_stencil;
  GLubyte *src_pixel_data;
  GLubyte *dst_pixel_data;
  GLuint src_pixel_offset;
  GLuint dst_pixel_offset;
  GLuint i;
  undefined4 local_6c;
  uint local_68;
  GLenum type;
  GLuint src_stencil_off;
  GLuint src_pixel_size;
  GLenum format;
  GLuint dst_texture_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst_texture_data;
  GLuint dst_pixel_size;
  Functions *gl;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *src_texture_data_local;
  bool is_stencil_local;
  GLenum source_internal_format_local;
  GLuint id_local;
  FunctionalTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  dst_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format);
  local_68 = 0;
  if (is_stencil) {
    src_stencil_off = 0x8d94;
    dst_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    local_6c = 0x1401;
  }
  else {
    src_stencil_off = 0x1903;
    dst_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
    local_6c = 0x1406;
  }
  if (source_internal_format == 0x88f0) {
    type = 4;
  }
  else {
    type = 8;
    local_68 = 4;
  }
  src_pixel_size =
       dst_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ << 6;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format,(ulong)src_pixel_size)
  ;
  (**(code **)(lVar7 + 0xb8))(0xde1,id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x468);
  GVar3 = src_stencil_off;
  uVar2 = local_6c;
  pcVar1 = *(code **)(lVar7 + 0xaa0);
  pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format,0);
  (*pcVar1)(0xde1,0,GVar3,uVar2,pvVar8);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x46b);
  (**(code **)(lVar7 + 0xb8))(0xde1,0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x46e);
  src_pixel_offset = 0;
  do {
    if (0x3f < src_pixel_offset) {
      this_local._7_1_ = true;
LAB_010d22f9:
      src_depth_i = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format);
      return this_local._7_1_;
    }
    dst_pixel_data._4_4_ =
         dst_texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ * src_pixel_offset;
    dst_pixel_data._0_4_ = type * src_pixel_offset;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format,0);
    src_pixel_data = pvVar8 + dst_pixel_data._4_4_;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (src_texture_data,0);
    pfStack_98 = (float *)(pvVar9 + (uint)dst_pixel_data);
    if (is_stencil) {
      local_99 = *src_pixel_data;
      local_9a = *(byte *)((long)pfStack_98 + (ulong)local_68);
      if (local_9a != local_99) {
        pTVar10 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar11 = tcu::TestContext::getLog(pTVar10);
        tcu::TestLog::operator<<(&local_220,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_220,(char (*) [16])"Invalid pixel [");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&src_pixel_offset);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [9])"], got: ");
        local_224 = (uint)local_99;
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_224);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [12])0x2b48384);
        dst_depth = (GLfloat)(uint)local_9a;
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(uint *)&dst_depth);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_220);
        this_local._7_1_ = false;
        goto LAB_010d22f9;
      }
    }
    else if (source_internal_format == 0x88f0) {
      src_depth_f = *(GLfloat *)src_pixel_data;
      local_234 = (uint)*(uint3 *)((long)pfStack_98 + 1);
      local_238 = (float)local_234 / 16777215.0;
      fVar13 = de::abs<float>(local_238 - src_depth_f);
      if (0.0001 < fVar13) {
        pTVar10 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar11 = tcu::TestContext::getLog(pTVar10);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&src_depth,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message)
        ;
        pMVar12 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&src_depth,(char (*) [16])"Invalid pixel [");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&src_pixel_offset);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [9])"], got: ");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&src_depth_f);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [12])0x2b48384);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_238);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&src_depth);
        this_local._7_1_ = false;
        goto LAB_010d22f9;
      }
    }
    else {
      local_3bc = *(float *)src_pixel_data;
      local_3c0 = *pfStack_98;
      fVar13 = de::abs<float>(local_3c0 - local_3bc);
      if (0.0001 < fVar13) {
        pTVar10 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar11 = tcu::TestContext::getLog(pTVar10);
        tcu::TestLog::operator<<(&local_540,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar12 = tcu::MessageBuilder::operator<<(&local_540,(char (*) [16])"Invalid pixel [");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&src_pixel_offset);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [9])"], got: ");
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3bc);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [12])0x2b48384);
        pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_3c0);
        tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_540);
        this_local._7_1_ = false;
        goto LAB_010d22f9;
      }
    }
    src_pixel_offset = src_pixel_offset + 1;
  } while( true );
}

Assistant:

bool FunctionalTest::verifyTexture(GLuint id, GLenum source_internal_format, bool is_stencil,
								   const std::vector<GLubyte>& src_texture_data)
{
	static const GLuint  n_pixels		= m_width * m_height;
	const Functions&	 gl				= m_context.getRenderContext().getFunctions();
	GLuint				 dst_pixel_size = 0;
	std::vector<GLubyte> dst_texture_data;
	GLuint				 dst_texture_size = 0;
	GLenum				 format			  = 0;
	GLuint				 src_pixel_size   = 0;
	GLuint				 src_stencil_off  = 0;
	GLenum				 type			  = 0;

	/* Select size of pixel */
	if (true == is_stencil)
	{
		format		   = GL_RED_INTEGER;
		dst_pixel_size = 1;
		type		   = GL_UNSIGNED_BYTE;
	}
	else
	{
		format		   = GL_RED;
		dst_pixel_size = 4;
		type		   = GL_FLOAT;
	}

	if (GL_DEPTH24_STENCIL8 == source_internal_format)
	{
		src_pixel_size = 4;
	}
	else
	{
		src_pixel_size  = 8;
		src_stencil_off = 4;
	}

	/* Allocate storage */
	dst_texture_size = dst_pixel_size * n_pixels;
	dst_texture_data.resize(dst_texture_size);

	/* Get texture contents */
	gl.bindTexture(GL_TEXTURE_2D, id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, format, type, &dst_texture_data[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

	gl.bindTexture(GL_TEXTURE_2D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* For each pixel */
	for (GLuint i = 0; i < n_pixels; ++i)
	{
		const GLuint dst_pixel_offset = dst_pixel_size * i;
		const GLuint src_pixel_offset = src_pixel_size * i;

		const GLubyte* dst_pixel_data = &dst_texture_data[0] + dst_pixel_offset;
		const GLubyte* src_pixel_data = &src_texture_data[0] + src_pixel_offset;

		if (true == is_stencil) /* Stencil channel */
		{
			const GLubyte dst_stencil = dst_pixel_data[0];
			const GLubyte src_stencil = src_pixel_data[src_stencil_off];

			if (src_stencil != dst_stencil)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid pixel [" << i
													<< "], got: " << (GLuint)dst_stencil
													<< " expected: " << (GLuint)src_stencil << tcu::TestLog::EndMessage;

				return false;
			}
		}
		else /* Depth channel */
		{
			if (GL_DEPTH24_STENCIL8 == source_internal_format) /* DEPTH24 */
			{
				GLfloat dst_depth   = 0.0f;
				GLuint  src_depth_i = 0;
				GLfloat src_depth_f = 0.0f;

				memcpy(&dst_depth, dst_pixel_data, 4);
				memcpy(&src_depth_i, src_pixel_data + 1, 3);

				src_depth_f = ((GLfloat)src_depth_i) / ((GLfloat)0xffffff);

				if (de::abs(src_depth_f - dst_depth) > 0.0001f)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid pixel [" << i
														<< "], got: " << dst_depth << " expected: " << src_depth_f
														<< tcu::TestLog::EndMessage;

					return false;
				}
			}
			else /* DEPTH32F */
			{
				GLfloat dst_depth = 0.0f;
				GLfloat src_depth = 0.0f;

				memcpy(&dst_depth, dst_pixel_data, 4);
				memcpy(&src_depth, src_pixel_data, 4);

				if (de::abs(src_depth - dst_depth) > 0.0001f)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid pixel [" << i
														<< "], got: " << dst_depth << " expected: " << src_depth
														<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}